

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void hit_trap(loc grid,wchar_t delayed)

{
  effect *peVar1;
  loc grid1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  trap *ptVar6;
  trap *ptVar7;
  trap_kind *ptVar8;
  trap *trap;
  source sVar9;
  source origin;
  source origin_00;
  _Bool ident;
  wchar_t local_3c;
  loc local_38;
  
  ident = false;
  local_3c = delayed;
  ptVar6 = square_trap(cave,grid);
  local_38 = grid;
  do {
    while( true ) {
      do {
        trap = ptVar6;
        if (trap == (trap *)0x0) goto LAB_001c51be;
        ptVar6 = trap->next;
        _Var3 = flag_has_dbg(trap->kind->flags,3,2,"trap->kind->flags","TRF_TRAP");
      } while (((!_Var3) || (trap->timeout != '\0')) ||
              ((_Var3 = flag_has_dbg(trap->kind->flags,3,0xe,"trap->kind->flags","TRF_DELAY"),
               local_3c != L'\xffffffff' && ((uint)_Var3 != local_3c))));
      _Var3 = player_is_trapsafe(player);
      if (!_Var3) break;
      _Var3 = player_of_has(player,L'(');
      if (_Var3) {
        equip_learn_flag(player,L'(');
      }
LAB_001c5162:
      flag_on_dbg(trap->flags,3,3,"trap->flags","TRF_VISIBLE");
    }
    disturb(player);
    ptVar8 = trap->kind;
    if (ptVar8->msg != (char *)0x0) {
      msg("%s");
      ptVar8 = trap->kind;
    }
    wVar4 = flag_next(ptVar8->save_flags,6,1);
    bVar2 = false;
    for (; wVar4 != L'\0'; wVar4 = flag_next(trap->kind->save_flags,6,wVar4 + L'\x01')) {
      _Var3 = player_of_has(player,wVar4);
      if (_Var3) {
        equip_learn_flag(player,wVar4);
        bVar2 = true;
      }
    }
    _Var3 = flag_has_dbg(trap->kind->flags,3,0xc,"trap->kind->flags","TRF_SAVE_ARMOR");
    if (_Var3) {
      _Var3 = check_hit(player,L'}');
      bVar2 = (bool)(!_Var3 | bVar2);
    }
    _Var3 = flag_has_dbg(trap->kind->flags,3,0xb,"trap->kind->flags","TRF_SAVE_THROW");
    if (_Var3) {
      wVar4 = Rand_div(100);
      if ((bool)(wVar4 < (player->state).skills[3] | bVar2)) goto LAB_001c5076;
LAB_001c4f55:
      grid = local_38;
      ptVar8 = trap->kind;
      if (ptVar8->msg_bad != (char *)0x0) {
        msg("%s");
        ptVar8 = trap->kind;
      }
      peVar1 = ptVar8->effect;
      sVar9 = source_trap(trap);
      origin.which = sVar9.which;
      origin._4_4_ = 0;
      origin.what = sVar9.what;
      effect_do(peVar1,origin,(object *)0x0,&ident,false,L'\0',L'\0',L'\0',(command *)0x0);
      ptVar7 = square_trap(cave,grid);
      if ((ptVar7 == (trap *)0x0) || (player->is_dead != false)) {
LAB_001c51be:
        square_memorize_traps((chunk *)cave,grid);
        _Var3 = square_isseen(cave,grid);
        if (_Var3) {
          square_light_spot((chunk *)cave,grid);
        }
        return;
      }
      if ((trap->kind->effect_xtra != (effect *)0x0) && (uVar5 = Rand_div(2), uVar5 == 0)) {
        ptVar8 = trap->kind;
        if (ptVar8->msg_xtra != (char *)0x0) {
          msg("%s");
          ptVar8 = trap->kind;
        }
        peVar1 = ptVar8->effect_xtra;
        sVar9 = source_trap(trap);
        origin_00.which = sVar9.which;
        origin_00._4_4_ = 0;
        origin_00.what = sVar9.what;
        effect_do(peVar1,origin_00,(object *)0x0,&ident,false,L'\0',L'\0',L'\0',(command *)0x0);
        ptVar7 = square_trap(cave,grid);
        if ((ptVar7 == (trap *)0x0) || (player->is_dead != false)) goto LAB_001c51be;
      }
    }
    else {
      if (!bVar2) goto LAB_001c4f55;
LAB_001c5076:
      grid = local_38;
      if (trap->kind->msg_good != (char *)0x0) {
        msg("%s");
      }
    }
    _Var3 = flag_has_dbg(trap->kind->flags,3,7,"trap->kind->flags","TRF_DOWN");
    if (_Var3) {
      wVar4 = player_get_next_place((int)player->place,"down",L'\x01');
      player_change_place(player,wVar4);
    }
    _Var3 = flag_has_dbg(trap->kind->flags,3,8,"trap->kind->flags","TRF_PIT");
    if ((_Var3) && (_Var3 = loc_eq(player->grid,(loc_conflict)trap->grid), !_Var3)) {
      grid1.x = (player->grid).x;
      grid1.y = (player->grid).y;
      monster_swap(grid1,trap->grid);
      player_handle_post_move(player,false,true);
    }
    _Var3 = flag_has_dbg(trap->kind->flags,3,9,"trap->kind->flags","TRF_ONETIME");
    if ((!_Var3) && (uVar5 = Rand_div(3), uVar5 != 0)) goto LAB_001c5162;
    _Var3 = square_remove_trap((chunk *)cave,grid,trap,false);
    if (!_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                    ,0x270,"void hit_trap(struct loc, int)");
    }
  } while( true );
}

Assistant:

extern void hit_trap(struct loc grid, int delayed)
{
	bool ident = false;
	struct trap *trap, *next_trap;
	struct effect *effect;

	/* Look at the traps in this grid */
	for (trap = square_trap(cave, grid); trap; trap = next_trap) {
		int flag;
		bool saved = false;

		next_trap = trap->next;

		/* Require that trap be capable of affecting the character */
		if (!trf_has(trap->kind->flags, TRF_TRAP)) continue;
		if (trap->timeout) continue;

		if (delayed != trf_has(trap->kind->flags, TRF_DELAY) &&
		    delayed != -1)
			continue;

		if (player_is_trapsafe(player)) {
			/* Trap immune player learns the rune */
			if (player_of_has(player, OF_TRAP_IMMUNE)) {
				equip_learn_flag(player, OF_TRAP_IMMUNE);
			}
			/* Trap becomes visible. */
			trf_on(trap->flags, TRF_VISIBLE);
			continue;
		}

		/* Disturb the player */
		disturb(player);

		/* Give a message */
		if (trap->kind->msg)
			msg("%s", trap->kind->msg);

		/* Test for save due to flag */
		for (flag = of_next(trap->kind->save_flags, FLAG_START);
			 flag != FLAG_END;
			 flag = of_next(trap->kind->save_flags, flag + 1))
			if (player_of_has(player, flag)) {
				saved = true;
				equip_learn_flag(player, flag);
			}

		/* Test for save due to armor */
		if (trf_has(trap->kind->flags, TRF_SAVE_ARMOR)
			&& !check_hit(player, 125))
			saved = true;

		/* Test for save due to saving throw */
		if (trf_has(trap->kind->flags, TRF_SAVE_THROW) &&
			(randint0(100) < player->state.skills[SKILL_SAVE]))
			saved = true;

		/* Save, or fire off the trap */
		if (saved) {
			if (trap->kind->msg_good)
				msg("%s", trap->kind->msg_good);
		} else {
			if (trap->kind->msg_bad)
				msg("%s", trap->kind->msg_bad);
			effect = trap->kind->effect;
			effect_do(effect, source_trap(trap), NULL, &ident, false, 0, 0, 0, NULL);

			/* Trap may have gone or the player may be dead */
			if (!square_trap(cave, grid) || player->is_dead) break;

			/* Do any extra effects */
			if (trap->kind->effect_xtra && one_in_(2)) {
				if (trap->kind->msg_xtra)
					msg("%s", trap->kind->msg_xtra);
				effect = trap->kind->effect_xtra;
				effect_do(effect, source_trap(trap), NULL, &ident, false,
						  0, 0, 0, NULL);

				/* Trap may have gone or the player may be dead */
				if (!square_trap(cave, grid) || player->is_dead) break;
			}
		}

		/* Some traps drop you a dungeon level */
		if (trf_has(trap->kind->flags, TRF_DOWN)) {
			int target_place = player_get_next_place(player->place, "down", 1);
			player_change_place(player,	target_place);
		}

		/* Some traps drop you onto them */
		if (trf_has(trap->kind->flags, TRF_PIT)
				&& !loc_eq(player->grid, trap->grid)) {
			monster_swap(player->grid, trap->grid);
			/*
			 * Don't retrigger the trap, but handle the
			 * other side effects of an involuntary move of the
			 * player.
			 */
			player_handle_post_move(player, false, true);
		}

		/* Some traps disappear after activating, all have a chance to */
		if (trf_has(trap->kind->flags, TRF_ONETIME) || one_in_(3)) {
			if (!square_remove_trap(cave, grid, trap, false)) {
				assert(0);
			}
		} else {
			/* Trap becomes visible */
			trf_on(trap->flags, TRF_VISIBLE);
		}
	}

	/* Update the player's view. */
	square_memorize_traps(cave, grid);
	if (square_isseen(cave, grid)) {
		square_light_spot(cave, grid);
	}
}